

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppEVar1;
  pointer *ppVVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  pointer pVVar4;
  pointer pEVar5;
  bool bVar6;
  bool bVar7;
  pointer __src;
  int8_t *piVar8;
  byte bVar9;
  char cVar10;
  uchar uVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined4 extraout_var;
  Logger *pLVar18;
  ulong uVar19;
  aiNode *this_00;
  aiNode **__s;
  aiMesh **__s_00;
  aiNode *this_01;
  mapped_type_conflict3 *pmVar20;
  aiMesh *this_02;
  ulong *puVar21;
  aiFace *paVar22;
  uint *puVar23;
  undefined8 uVar24;
  aiVector3D *paVar25;
  runtime_error *this_03;
  Edge *edge;
  long lVar26;
  pointer pEVar27;
  aiFace *paVar28;
  uint uVar29;
  mapped_type_conflict3 mVar30;
  pointer pFVar31;
  pointer __src_00;
  size_t __n;
  pointer puVar32;
  ulong uVar33;
  pointer pOVar34;
  float fVar35;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  StreamReaderBE reader;
  FaceTable face_table;
  ulong local_278;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_268;
  aiNode *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  aiScene *local_230;
  uint local_224;
  undefined1 local_220 [32];
  aiNode *local_200;
  pointer local_1f8;
  aiVector3t<float> *local_1f0;
  aiVector3D **local_1e8;
  StreamReader<true,_false> local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 uStack_188;
  uint uStack_180;
  undefined4 uStack_17c;
  ios_base local_138 [264];
  
  local_230 = pScene;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar14 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  StreamReader<true,_false>::StreamReader
            (&local_1e0,(IOStream *)CONCAT44(extraout_var,iVar14),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  piVar8 = local_1e0.current;
  StreamReader<true,_false>::IncPtr(&local_1e0,9);
  iVar14 = strncmp("nendo ",piVar8,6);
  if (iVar14 != 0) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Not a Nendo file; magic signature missing","");
    std::runtime_error::runtime_error(this_03,(string *)local_1a8);
    *(undefined ***)this_03 = &PTR__runtime_error_008dc448;
    __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar9 = piVar8[6];
  iVar15 = -(bVar9 - 0x31);
  iVar14 = iVar15;
  if (bVar9 == 0x31) {
    if ((byte)piVar8[7] - 0x2e == 0) {
      iVar14 = 0x30 - (uint)(byte)piVar8[8];
    }
    else {
      iVar14 = -((byte)piVar8[7] - 0x2e);
    }
    if (iVar14 != 0) {
      if ((byte)piVar8[7] - 0x2e == 0) {
        iVar14 = 0x31 - (uint)(byte)piVar8[8];
      }
      else {
        iVar14 = -((byte)piVar8[7] - 0x2e);
      }
      goto LAB_00448920;
    }
    pLVar18 = DefaultLogger::get();
    Logger::info(pLVar18,"NDO file format is 1.0");
    bVar7 = true;
  }
  else {
LAB_00448920:
    if (iVar14 != 0) {
      if (bVar9 == 0x31) {
        if ((byte)piVar8[7] - 0x2e == 0) {
          iVar15 = 0x32 - (uint)(byte)piVar8[8];
        }
        else {
          iVar15 = -((byte)piVar8[7] - 0x2e);
        }
      }
      if (iVar15 == 0) {
        pLVar18 = DefaultLogger::get();
        Logger::info(pLVar18,"NDO file format is 1.2");
      }
      else {
        pLVar18 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[65]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [65])
                    "Unrecognized nendo file format version, continuing happily ... :");
        local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)(piVar8 + 6);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   (char **)&local_268);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar18,(char *)local_220._0_8_);
        if ((pointer)local_220._0_8_ != (pointer)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar6 = true;
      bVar7 = false;
      goto LAB_00448a15;
    }
    pLVar18 = DefaultLogger::get();
    Logger::info(pLVar18,"NDO file format is 1.1");
    bVar7 = false;
  }
  bVar6 = false;
LAB_00448a15:
  StreamReader<true,_false>::IncPtr(&local_1e0,2);
  if (bVar6) {
    StreamReader<true,_false>::IncPtr(&local_1e0,2);
  }
  bVar9 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220,(ulong)bVar9,(allocator_type *)local_1a8);
  if (local_220._8_8_ != local_220._0_8_) {
    local_278 = 0;
    do {
      cVar10 = StreamReader<true,_false>::Get<signed_char>(&local_1e0);
      if (cVar10 != '\0') {
        pOVar34 = (pointer)(local_220._0_8_ + local_278 * 0x68);
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        piVar8 = local_1e0.current;
        StreamReader<true,_false>::IncPtr(&local_1e0,(ulong)(uVar16 + 0x4c));
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,piVar8,piVar8 + uVar16);
        std::__cxx11::string::operator=((string *)pOVar34,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        local_250 = (aiNode *)&pOVar34->edges;
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                  ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_> *)
                   local_250,(ulong)uVar16);
        if (uVar16 != 0) {
          uVar29 = 0;
          do {
            uStack_188._0_4_ = 0;
            uStack_188._4_1_ = '\0';
            uStack_188._5_1_ = '\0';
            uStack_188._6_1_ = '\0';
            uStack_188._7_1_ = '\0';
            uStack_180 = 0;
            local_198._M_allocated_capacity = 0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a8._8_8_ = 0;
            __position._M_current =
                 (pOVar34->edges).
                 super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
              _M_realloc_insert<Assimp::NDOImporter::Edge>
                        ((vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                          *)local_250,__position,(Edge *)local_1a8);
            }
            else {
              *(undefined8 *)((__position._M_current)->edge + 7) = 0;
              (__position._M_current)->color[0] = '\0';
              (__position._M_current)->color[1] = '\0';
              (__position._M_current)->color[2] = '\0';
              (__position._M_current)->color[3] = '\0';
              (__position._M_current)->color[4] = '\0';
              (__position._M_current)->color[5] = '\0';
              (__position._M_current)->color[6] = '\0';
              (__position._M_current)->color[7] = '\0';
              (__position._M_current)->edge[4] = 0;
              (__position._M_current)->edge[5] = 0;
              (__position._M_current)->edge[6] = 0;
              (__position._M_current)->edge[7] = 0;
              (__position._M_current)->edge[0] = 0;
              (__position._M_current)->edge[1] = 0;
              (__position._M_current)->edge[2] = 0;
              (__position._M_current)->edge[3] = 0;
              ppEVar1 = &(pOVar34->edges).
                         super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppEVar1 = *ppEVar1 + 1;
            }
            pEVar27 = (pOVar34->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            lVar26 = -0xb;
            do {
              if (bVar6) {
                uVar17 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
              }
              else {
                uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
                uVar17 = (uint)uVar12;
              }
              pEVar27->edge[lVar26] = uVar17;
              lVar26 = lVar26 + 1;
            } while (lVar26 != -3);
            uVar17 = 0;
            if (!bVar7) {
              bVar9 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar17 = (uint)bVar9;
            }
            pEVar27[-1].hard = uVar17;
            lVar26 = -8;
            do {
              uVar11 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              *(uchar *)((long)pEVar27->edge + lVar26) = uVar11;
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0);
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar16);
        }
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                  (&pOVar34->faces,(ulong)uVar16);
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
          __position_00._M_current =
               (pOVar34->faces).
               super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pOVar34->faces).
              super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
            _M_realloc_insert<Assimp::NDOImporter::Face>
                      (&pOVar34->faces,__position_00,(Face *)local_1a8);
            pFVar31 = (pOVar34->faces).
                      super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (__position_00._M_current)->elem = 0;
            pFVar31 = (pOVar34->faces).
                      super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
            (pOVar34->faces).
            super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
            ._M_impl.super__Vector_impl_data._M_finish = pFVar31;
          }
          if (bVar6) {
            uVar29 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar29 = (uint)uVar12;
          }
          pFVar31[-1].elem = uVar29;
        }
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        reserve(&pOVar34->vertices,(ulong)uVar16);
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1a8._8_8_ = 0;
          __position_01._M_current =
               (pOVar34->vertices).
               super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_01._M_current ==
              (pOVar34->vertices).
              super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
            _M_realloc_insert<Assimp::NDOImporter::Vertex>
                      (&pOVar34->vertices,__position_01,(Vertex *)local_1a8);
          }
          else {
            (__position_01._M_current)->num = 0;
            ((__position_01._M_current)->val).x = 0.0;
            ((__position_01._M_current)->val).y = 0.0;
            ((__position_01._M_current)->val).z = 0.0;
            ppVVar2 = &(pOVar34->vertices).
                       super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar2 = *ppVVar2 + 1;
          }
          pVVar4 = (pOVar34->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar6) {
            uVar29 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar29 = (uint)uVar12;
          }
          pVVar4[-1].num = uVar29;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar4[-1].val.x = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar4[-1].val.y = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar4[-1].val.z = fVar35;
        }
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          if (bVar6) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        if (bVar6) {
          uVar16 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar16 = (uint)uVar12;
        }
        for (; uVar16 != 0; uVar16 = uVar16 - 1) {
          if (bVar6) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        uVar11 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
        if (uVar11 != '\0') {
          uVar12 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar13 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          if ((uint)uVar13 * (uint)uVar12 != 0) {
            uVar16 = 0;
            do {
              bVar9 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar16 = uVar16 + bVar9;
            } while (uVar16 < (uint)uVar13 * (uint)uVar12);
          }
        }
      }
      local_278 = (ulong)((int)local_278 + 1);
      uVar19 = ((long)(local_220._8_8_ - local_220._0_8_) >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (local_278 <= uVar19 && uVar19 - local_278 != 0);
  }
  this_00 = (aiNode *)operator_new(0x478);
  local_200 = this_00;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"$NDODummyRoot","");
  aiNode::aiNode(this_00,(string *)local_1a8);
  local_230->mRootNode = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1f8 = (pointer)local_220._8_8_;
  uVar16 = (int)((long)(local_220._8_8_ - local_220._0_8_) >> 3) * -0x3b13b13b;
  this_00->mNumChildren = uVar16;
  uVar19 = (ulong)uVar16 << 3;
  __s = (aiNode **)operator_new__(uVar19);
  memset(__s,0,uVar19);
  this_00->mChildren = __s;
  __s_00 = (aiMesh **)operator_new__(uVar19);
  memset(__s_00,0,uVar19);
  local_230->mMeshes = __s_00;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  pOVar34 = (pointer)local_220._0_8_;
  if ((pointer)local_220._0_8_ != local_1f8) {
    do {
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01,&pOVar34->name);
      *__s = this_01;
      this_01->mParent = this_00;
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = local_1a8 + 8;
      uStack_180 = 0;
      uStack_17c = 0;
      pEVar27 = (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar5 = (pOVar34->edges).
               super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_250 = this_01;
      uStack_188 = (_Rb_tree_node_base *)local_198._8_8_;
      if (pEVar27 != pEVar5) {
        mVar30 = 0;
        do {
          pmVar20 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar27->edge + 2);
          *pmVar20 = mVar30;
          pmVar20 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar27->edge + 3);
          *pmVar20 = mVar30;
          mVar30 = mVar30 + 1;
          pEVar27 = pEVar27 + 1;
        } while (pEVar27 != pEVar5);
      }
      this_02 = (aiMesh *)operator_new(0x520);
      this_02->mPrimitiveTypes = 0;
      this_02->mNumVertices = 0;
      local_1e8 = &this_02->mVertices;
      memset(local_1e8,0,0xcc);
      this_02->mBones = (aiBone **)0x0;
      this_02->mMaterialIndex = 0;
      (this_02->mName).length = 0;
      (this_02->mName).data[0] = '\0';
      memset((this_02->mName).data + 1,0x1b,0x3ff);
      this_02->mNumAnimMeshes = 0;
      this_02->mAnimMeshes = (aiAnimMesh **)0x0;
      this_02->mMethod = 0;
      (this_02->mAABB).mMin.x = 0.0;
      (this_02->mAABB).mMin.y = 0.0;
      (this_02->mAABB).mMin.z = 0.0;
      (this_02->mAABB).mMax.x = 0.0;
      (this_02->mAABB).mMax.y = 0.0;
      (this_02->mAABB).mMax.z = 0.0;
      memset(this_02->mColors,0,0xa0);
      uVar16 = uStack_180;
      lVar26 = CONCAT44(uStack_17c,uStack_180);
      this_02->mNumFaces = uStack_180;
      uVar19 = (ulong)uStack_180;
      puVar21 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
      *puVar21 = uVar19;
      paVar28 = (aiFace *)(puVar21 + 1);
      if (uVar16 != 0) {
        paVar22 = paVar28;
        do {
          paVar22->mNumIndices = 0;
          paVar22->mIndices = (uint *)0x0;
          paVar22 = paVar22 + 1;
        } while (paVar22 != paVar28 + uVar19);
      }
      this_02->mFaces = paVar28;
      if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&local_268,lVar26 << 2);
      __src_00 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar24 = local_198._8_8_;
      puVar32 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((_Rb_tree_node_base *)local_198._8_8_ != (_Rb_tree_node_base *)(local_1a8 + 8)) {
        do {
          if (puVar32 != __src_00) {
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __src_00;
          }
          _Var3 = ((_Rb_tree_node_base *)(uVar24 + 0x20))->_M_color;
          uVar16 = *(uint *)&((_Rb_tree_node_base *)(uVar24 + 0x20))->field_0x4;
          do {
            pEVar27 = (pOVar34->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar19 = (ulong)(_Var3 == pEVar27[uVar16].edge[3]);
            uVar29 = pEVar27[uVar16].edge[uVar19];
            uVar16 = pEVar27[uVar16].edge[uVar19 + 4];
            local_224 = (int)((ulong)((long)local_268.
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_268.
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x55555555;
            if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_248,
                         (iterator)
                         local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_224);
            }
            else {
              *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_224;
              local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            pVVar4 = (pOVar34->vertices).
                     super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            paVar25 = &pVVar4[uVar29].val;
            if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>const&>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_268,
                         (iterator)
                         local_268.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish,paVar25);
            }
            else {
              (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->z = pVVar4[uVar29].val.z;
              fVar35 = paVar25->y;
              (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->x = paVar25->x;
              (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->y = fVar35;
              local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_268.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            puVar32 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            __src_00 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar16 != *(uint *)&((_Rb_tree_node_base *)(uVar24 + 0x20))->field_0x4);
          uVar19 = (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          paVar28->mNumIndices = (uint)(uVar19 >> 2);
          puVar23 = (uint *)operator_new__(uVar19 & 0x3fffffffc);
          paVar28->mIndices = puVar23;
          if (puVar32 != __src_00) {
            memmove(puVar23,__src_00,uVar19);
          }
          uVar24 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar24);
          paVar28 = paVar28 + 1;
        } while ((_Rb_tree_node_base *)uVar24 != (_Rb_tree_node_base *)(local_1a8 + 8));
      }
      __src = local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
      local_1f0 = local_268.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      __n = (long)local_268.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_268.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      uVar33 = ((long)__n >> 2) * -0x5555555555555555;
      uVar16 = (uint)uVar33;
      this_02->mNumVertices = uVar16;
      uVar33 = uVar33 & 0xffffffff;
      uVar19 = uVar33 * 0xc;
      paVar25 = (aiVector3D *)operator_new__(uVar19);
      if (uVar33 != 0) {
        memset(paVar25,0,((uVar19 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_1e8 = paVar25;
      if (local_1f0 != __src) {
        memmove(paVar25,__src,__n);
      }
      if (uVar16 == 0) {
        aiMesh::~aiMesh(this_02);
        operator_delete(this_02);
      }
      else {
        local_230->mMeshes[local_230->mNumMeshes] = this_02;
        uVar16 = local_230->mNumMeshes;
        local_230->mNumMeshes = uVar16 + 1;
        local_250->mNumMeshes = 1;
        puVar23 = (uint *)operator_new__(4);
        local_250->mMeshes = puVar23;
        *puVar23 = uVar16;
      }
      __s = __s + 1;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_1a8);
      pOVar34 = pOVar34 + 1;
      this_00 = local_200;
    } while (pOVar34 != local_1f8);
    if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_268.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
    operator_delete(local_268.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220);
  StreamReader<true,_false>::~StreamReader(&local_1e0);
  return;
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}